

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::WeakFulfiller<kj::Promise<int>_>::detach
          (WeakFulfiller<kj::Promise<int>_> *this,PromiseFulfiller<kj::Promise<int>_> *from)

{
  PromiseFulfiller<kj::Promise<int>_> *from_local;
  WeakFulfiller<kj::Promise<int>_> *this_local;
  
  if (this->inner == (PromiseFulfiller<kj::Promise<int>_> *)0x0) {
    if (this != (WeakFulfiller<kj::Promise<int>_> *)0x0) {
      operator_delete(this,0x18);
    }
  }
  else {
    if (this->inner != from) {
      inlineRequireFailure
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-inl.h"
                 ,0x41e,"inner == &from","",(char *)0x0);
    }
    this->inner = (PromiseFulfiller<kj::Promise<int>_> *)0x0;
  }
  return;
}

Assistant:

void detach(PromiseFulfiller<T>& from) {
    if (inner == nullptr) {
      // Already disposed.
      delete this;
    } else {
      KJ_IREQUIRE(inner == &from);
      inner = nullptr;
    }
  }